

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnmerge.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  FILE *pFVar4;
  FILE *pFVar5;
  char *pcVar6;
  char *pcVar7;
  long lVar8;
  size_t sVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  char *__s;
  int iVar13;
  char *__filename;
  int top_count;
  int bottom_count;
  int layer_count;
  int blob_count;
  int magic;
  string ns;
  char layer_type [33];
  char layer_name [257];
  char bottom_name [257];
  char line [1024];
  uint local_1328;
  int local_1324;
  uint local_1320;
  uint local_131c;
  int local_1318;
  allocator local_1312;
  allocator local_1311;
  FILE *local_1310;
  int local_1308;
  int local_1304;
  ulong local_1300;
  char **local_12f8;
  char *local_12f0;
  int local_12e4;
  FILE *local_12e0;
  char *local_12d8;
  undefined1 *local_12d0 [2];
  undefined1 local_12c0 [16];
  ulong local_12b0;
  undefined1 *local_12a8 [2];
  undefined1 local_1298 [16];
  undefined1 local_1288 [48];
  undefined1 local_1258 [272];
  undefined1 local_1148 [272];
  char local_1038 [4104];
  
  local_12f8 = argv;
  if ((argc < 7) || ((argc - 1U & 1) != 0)) {
    main_cold_1();
    iVar2 = -1;
  }
  else {
    pcVar7 = argv[argc - 1U];
    pFVar4 = fopen(argv[(ulong)(uint)argc - 2],"wb");
    pFVar5 = fopen(pcVar7,"wb");
    fwrite("7767517\n",8,1,pFVar4);
    local_1310 = pFVar4;
    fwrite("           \n",0xc,1,pFVar4);
    uVar12 = argc - 3;
    local_1300 = (ulong)uVar12;
    local_131c = 0;
    local_1328 = 0;
    if (1 < uVar12) {
      local_1300 = (ulong)(uVar12 >> 1);
      uVar10 = 0;
      local_1328 = 0;
      local_131c = 0;
      local_12e0 = pFVar5;
      do {
        pcVar7 = local_12f8[uVar10 * 2 + 1];
        __filename = local_12f8[uVar10 * 2 + 2];
        local_12b0 = uVar10;
        pcVar6 = strrchr(pcVar7,0x2f);
        __s = pcVar6 + 1;
        if (pcVar6 == (char *)0x0) {
          __s = pcVar7;
        }
        local_12f0 = pcVar7;
        pcVar7 = strrchr(__s,0x2e);
        if (pcVar7 == (char *)0x0) {
          std::__cxx11::string::string((string *)local_12d0,__s,&local_1312);
        }
        else {
          std::__cxx11::string::string((string *)local_12a8,__s,&local_1311);
          std::__cxx11::string::substr((ulong)local_12d0,(ulong)local_12a8);
          if (local_12a8[0] != local_1298) {
            operator_delete(local_12a8[0]);
          }
        }
        pFVar5 = fopen(local_12f0,"rb");
        local_12d8 = __filename;
        if (pFVar5 == (FILE *)0x0) {
          fprintf(_stderr,"fopen %s failed\n",local_12f0);
        }
        else {
          local_1304 = 0;
          uVar12 = __isoc99_fscanf(pFVar5,"%d",&local_1304);
          if ((uVar12 == 1) && (local_1304 == 0x7685dd)) {
            local_1318 = 0;
            local_1308 = 0;
            uVar12 = __isoc99_fscanf(pFVar5,"%d %d",&local_1318,&local_1308);
            if (uVar12 == 2) {
              local_1328 = local_1328 + local_1308;
              local_12e4 = local_1318;
              if (local_1318 < 1) {
LAB_00101709:
                fclose(pFVar5);
              }
              else {
                iVar2 = 0;
                do {
                  local_1320 = 0;
                  local_1324 = 0;
                  uVar12 = __isoc99_fscanf(pFVar5,"%32s %256s %d %d",local_1288,local_1258,
                                           &local_1320,&local_1324);
                  if (uVar12 == 4) {
                    fprintf(local_1310,"%-24s %s/%-24s %d %d",local_1288,local_12d0[0],local_1258,
                            (ulong)local_1320,local_1324);
                    bVar1 = 0 < (int)local_1320;
                    iVar11 = 5;
                    if (0 < (int)local_1320) {
                      iVar11 = 0;
                      do {
                        uVar12 = __isoc99_fscanf(pFVar5,"%256s",local_1148);
                        if (uVar12 != 1) {
                          fprintf(_stderr,"read bottom_name failed %d\n",(ulong)uVar12);
                          iVar11 = 1;
                          goto LAB_001015df;
                        }
                        fprintf(local_1310," %s/%s",local_12d0[0],local_1148);
                        iVar11 = iVar11 + 1;
                        bVar1 = iVar11 < (int)local_1320;
                      } while (iVar11 < (int)local_1320);
                      iVar11 = 5;
                    }
LAB_001015df:
                    if (!bVar1) {
                      bVar1 = 0 < local_1324;
                      iVar11 = 8;
                      if (0 < local_1324) {
                        iVar11 = 0;
                        do {
                          uVar12 = __isoc99_fscanf(pFVar5,"%256s",local_1148);
                          if (uVar12 != 1) {
                            fprintf(_stderr,"read top_name failed %d\n",(ulong)uVar12);
                            iVar11 = 1;
                            goto LAB_0010166f;
                          }
                          fprintf(local_1310," %s/%s",local_12d0[0],local_1148);
                          iVar11 = iVar11 + 1;
                          bVar1 = iVar11 < local_1324;
                        } while (iVar11 < local_1324);
                        iVar11 = 8;
                      }
LAB_0010166f:
                      if (!bVar1) {
                        pcVar7 = fgets(local_1038,0x400,pFVar5);
                        if (pcVar7 == (char *)0x0) {
                          fprintf(_stderr,"read line %s failed\n",local_12f0);
                          iVar11 = 2;
                        }
                        else {
                          fputs(local_1038,local_1310);
                          iVar11 = 0;
                        }
                      }
                    }
                  }
                  else {
                    fprintf(_stderr,"read layer params failed %d\n",(ulong)uVar12);
                    iVar11 = 1;
                  }
                  if (iVar11 != 0) goto LAB_001016ff;
                  iVar2 = iVar2 + 1;
                } while (iVar2 < local_1318);
                iVar11 = 2;
LAB_001016ff:
                __filename = local_12d8;
                if (iVar11 == 2) goto LAB_00101709;
              }
              local_131c = local_131c + local_12e4;
              goto LAB_00101719;
            }
            pcVar7 = "read layer_count and blob_count failed %d\n";
          }
          else {
            pcVar7 = "read magic failed %d\n";
          }
          fprintf(_stderr,pcVar7,(ulong)uVar12);
        }
LAB_00101719:
        if (local_12d0[0] != local_12c0) {
          operator_delete(local_12d0[0]);
        }
        pFVar4 = fopen(__filename,"rb");
        if (pFVar4 == (FILE *)0x0) {
          fprintf(_stderr,"fopen %s failed\n",__filename);
          pFVar5 = local_12e0;
        }
        else {
          iVar2 = 0;
          fseek(pFVar4,0,2);
          lVar8 = ftell(pFVar4);
          rewind(pFVar4);
          pFVar5 = local_12e0;
          iVar11 = (int)lVar8;
          if (0xfff < iVar11) {
            iVar13 = 0;
            do {
              sVar9 = fread(local_1038,1,0x1000,pFVar4);
              sVar9 = fwrite(local_1038,1,sVar9,pFVar5);
              iVar2 = iVar13 + (int)sVar9;
              iVar3 = (int)sVar9 + iVar13;
              iVar13 = iVar2;
            } while (iVar3 + 0xfff < iVar11);
          }
          sVar9 = fread(local_1038,1,(long)(iVar11 - iVar2),pFVar4);
          sVar9 = fwrite(local_1038,1,sVar9,pFVar5);
          if ((int)sVar9 + iVar2 != iVar11) {
            fprintf(_stderr,"copy %s incomplete\n",local_12d8);
          }
          fclose(pFVar4);
        }
        uVar10 = local_12b0 + 1;
      } while (uVar10 != local_1300);
    }
    pFVar4 = local_1310;
    rewind(local_1310);
    fwrite("7767517\n",8,1,pFVar4);
    fprintf(pFVar4,"%d %d",(ulong)local_131c,(ulong)local_1328);
    fclose(pFVar4);
    fclose(pFVar5);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc < 7 || (argc - 1) % 2 != 0)
    {
        fprintf(stderr, "Usage: %s [param1] [bin1] [param2] [bin2] ... [outparam] [outbin]\n", argv[0]);
        return -1;
    }

    const char* outparampath = argv[argc - 2];
    const char* outbinpath = argv[argc - 1];

    FILE* outparamfp = fopen(outparampath, "wb");
    FILE* outbinfp = fopen(outbinpath, "wb");

    // magic
    fprintf(outparamfp, "7767517\n");

    // layer count and blob count placeholder
    // 99999 is large enough I think  --- nihui
    fprintf(outparamfp, "           \n");

    int total_layer_count = 0;
    int total_blob_count = 0;

    const int model_count = (argc - 3) / 2;

    for (int i = 0; i < model_count; i++)
    {
        const char* parampath = argv[i * 2 + 1];
        const char* binpath = argv[i * 2 + 2];

        copy_param(parampath, outparamfp, &total_layer_count, &total_blob_count);
        copy_bin(binpath, outbinfp);
    }

    // the real layer count and blob count
    rewind(outparamfp);
    fprintf(outparamfp, "7767517\n");
    fprintf(outparamfp, "%d %d", total_layer_count, total_blob_count);

    fclose(outparamfp);
    fclose(outbinfp);

    return 0;
}